

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::getDualRaySparse(Highs *this,bool *has_dual_ray,HVector *row_ep_buffer)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  long in_RDX;
  HVectorBase<double> *in_RSI;
  long in_RDI;
  HEkk *this_00;
  HighsInt iRow;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar4;
  HEkk *in_stack_ffffffffffffffd0;
  
  *(bool *)&in_RSI->size = *(int *)(in_RDI + 0x4a40) != -1;
  if ((in_RSI->size & 1) != 0) {
    HEkk::setNlaPointersForLpAndScale
              (in_stack_ffffffffffffffd0,
               (HighsLp *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    HVectorBase<double>::clear(in_RSI);
    *(undefined4 *)(in_RDX + 4) = 1;
    *(undefined1 *)(in_RDX + 0x78) = 1;
    iVar1 = *(int *)(in_RDI + 0x4a40);
    iVar4 = iVar1;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDX + 8),0);
    *pvVar2 = iVar4;
    this_00 = (HEkk *)(double)*(int *)(in_RDI + 0x4a44);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDX + 0x20),(long)iVar1);
    *pvVar3 = (value_type)this_00;
    HEkk::btran(this_00,(HVector *)CONCAT44(iVar4,in_stack_ffffffffffffffc8),2.36134080619317e-317);
  }
  return kOk;
}

Assistant:

HighsStatus Highs::getDualRaySparse(bool& has_dual_ray,
                                    HVector& row_ep_buffer) {
  has_dual_ray = ekk_instance_.dual_ray_record_.index != kNoRayIndex;
  if (has_dual_ray) {
    ekk_instance_.setNlaPointersForLpAndScale(model_.lp_);
    row_ep_buffer.clear();
    row_ep_buffer.count = 1;
    row_ep_buffer.packFlag = true;
    HighsInt iRow = ekk_instance_.dual_ray_record_.index;
    row_ep_buffer.index[0] = iRow;
    row_ep_buffer.array[iRow] = ekk_instance_.dual_ray_record_.sign;

    ekk_instance_.btran(row_ep_buffer, ekk_instance_.info_.row_ep_density);
  }

  return HighsStatus::kOk;
}